

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::sse2::ConeCurveMiMBIntersector1<4,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  Geometry *pGVar15;
  long lVar16;
  long lVar17;
  Scene *pSVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  byte bVar23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  long lVar26;
  long lVar27;
  byte bVar28;
  int iVar29;
  long lVar30;
  RayQueryContext *pRVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  float fVar37;
  float fVar38;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar64 [16];
  float fVar74;
  uint uVar75;
  float fVar76;
  uint uVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  uint uVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar94;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [16];
  float fVar99;
  undefined1 auVar96 [16];
  uint uVar100;
  float fVar101;
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [16];
  float fVar110;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  float fVar121;
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar123 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar154 [16];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  RoundLineIntersectorHitM<4> hit;
  int local_31c;
  undefined1 local_318 [12];
  float fStack_30c;
  RayQueryContext *local_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  RTCFilterFunctionNArguments local_2b8;
  uint local_288;
  uint local_284;
  uint local_280;
  uint local_27c;
  float local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  Primitive *local_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  uint local_138 [4];
  undefined1 local_128 [16];
  float local_118 [4];
  uint local_108 [4];
  uint local_f8 [4];
  uint local_e8 [6];
  Scene *local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  uint local_b8 [4];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  local_d0 = context->scene;
  uVar33 = line->sharedGeomID;
  uVar34 = (line->v0).field_0.i[0];
  pGVar15 = (local_d0->geometries).items[uVar33].ptr;
  _local_2e8 = CONCAT44(fStack_2e4,pGVar15->fnumTimeSegments);
  fVar37 = (pGVar15->time_range).lower;
  fVar37 = (((ray->dir).field_0.m128[3] - fVar37) / ((pGVar15->time_range).upper - fVar37)) *
           pGVar15->fnumTimeSegments;
  _local_318 = ZEXT416((uint)fVar37);
  local_300 = context;
  fVar37 = floorf(fVar37);
  pSVar18 = local_d0;
  if (local_2e8 + -1.0 <= fVar37) {
    fVar37 = local_2e8 + -1.0;
  }
  fVar82 = 0.0;
  if (0.0 <= fVar37) {
    fVar82 = fVar37;
  }
  fVar37 = (float)local_318._0_4_ - fVar82;
  lVar16 = *(long *)&pGVar15[3].time_range.upper;
  lVar26 = (long)(int)fVar82 * 0x38;
  lVar17 = *(long *)(lVar16 + lVar26);
  lVar30 = *(long *)(lVar16 + 0x10 + lVar26);
  lVar24 = lVar17 + lVar30 * (ulong)uVar34;
  uVar35 = (line->v0).field_0.i[1];
  lVar27 = lVar17 + lVar30 * (ulong)uVar35;
  uVar36 = (line->v0).field_0.i[2];
  lVar1 = lVar17 + lVar30 * (ulong)uVar36;
  uVar100 = (line->v0).field_0.i[3];
  lVar2 = lVar17 + lVar30 * (ulong)uVar100;
  pfVar3 = (float *)(lVar17 + lVar30 * (ulong)(uVar34 + 1));
  pfVar4 = (float *)(lVar17 + lVar30 * (ulong)(uVar35 + 1));
  pfVar5 = (float *)(lVar17 + lVar30 * (ulong)(uVar36 + 1));
  pfVar6 = (float *)(lVar17 + lVar30 * (ulong)(uVar100 + 1));
  lVar17 = *(long *)(lVar16 + 0x38 + lVar26);
  lVar16 = *(long *)(lVar16 + 0x48 + lVar26);
  pfVar7 = (float *)(lVar17 + (ulong)uVar34 * lVar16);
  pfVar8 = (float *)(lVar17 + (ulong)uVar35 * lVar16);
  pfVar9 = (float *)(lVar17 + (ulong)uVar36 * lVar16);
  pfVar10 = (float *)(lVar17 + (ulong)uVar100 * lVar16);
  pfVar11 = (float *)(lVar17 + (ulong)(uVar34 + 1) * lVar16);
  lVar30 = (ulong)(uVar35 + 1) * lVar16;
  pfVar12 = (float *)(lVar17 + (ulong)(uVar36 + 1) * lVar16);
  pfVar13 = (float *)(lVar17 + lVar30);
  pfVar14 = (float *)(lVar17 + lVar16 * (ulong)(uVar100 + 1));
  fVar82 = 1.0 - fVar37;
  fVar61 = *(float *)(lVar1 + 8) * fVar82 + *pfVar7 * fVar37;
  fVar65 = *(float *)(lVar2 + 8) * fVar82 + *pfVar8 * fVar37;
  fVar68 = fStack_2e0 * fVar82 + *pfVar9 * fVar37;
  fVar71 = fStack_2dc * fVar82 + *pfVar10 * fVar37;
  fVar131 = *(float *)(lVar24 + 4) * fVar82 + pfVar7[1] * fVar37;
  fVar134 = *(float *)(lVar27 + 4) * fVar82 + pfVar8[1] * fVar37;
  fVar137 = *(float *)(lVar1 + 4) * fVar82 + pfVar9[1] * fVar37;
  fVar140 = *(float *)(lVar2 + 4) * fVar82 + pfVar10[1] * fVar37;
  fVar62 = *(float *)(lVar24 + 8) * fVar82 + pfVar7[2] * fVar37;
  fVar66 = *(float *)(lVar27 + 8) * fVar82 + pfVar8[2] * fVar37;
  fVar69 = fStack_2f0 * fVar82 + pfVar9[2] * fVar37;
  fVar72 = fStack_2ec * fVar82 + pfVar10[2] * fVar37;
  fVar110 = *(float *)(lVar24 + 0xc) * fVar82 + pfVar7[3] * fVar37;
  fVar113 = *(float *)(lVar27 + 0xc) * fVar82 + pfVar8[3] * fVar37;
  fVar114 = *(float *)(lVar1 + 0xc) * fVar82 + pfVar9[3] * fVar37;
  fVar115 = *(float *)(lVar2 + 0xc) * fVar82 + pfVar10[3] * fVar37;
  fVar101 = *pfVar3 * fVar82 + *pfVar11 * fVar37;
  fVar104 = *pfVar4 * fVar82 + *pfVar13 * fVar37;
  fVar106 = *pfVar5 * fVar82 + *pfVar12 * fVar37;
  fVar108 = *pfVar6 * fVar82 + *pfVar14 * fVar37;
  fVar74 = pfVar3[1] * fVar82 + pfVar11[1] * fVar37;
  fVar76 = pfVar4[1] * fVar82 + pfVar13[1] * fVar37;
  fVar78 = pfVar5[1] * fVar82 + pfVar12[1] * fVar37;
  fVar80 = pfVar6[1] * fVar82 + pfVar14[1] * fVar37;
  fVar44 = pfVar3[2] * fVar82 + pfVar11[2] * fVar37;
  fVar52 = pfVar4[2] * fVar82 + pfVar13[2] * fVar37;
  fVar55 = fStack_2d0 * fVar82 + pfVar12[2] * fVar37;
  fVar58 = fStack_2cc * fVar82 + pfVar14[2] * fVar37;
  fVar83 = fVar82 * pfVar3[3] + fVar37 * pfVar11[3];
  fVar88 = fVar82 * pfVar4[3] + fVar37 * pfVar13[3];
  fVar90 = fVar82 * pfVar5[3] + fVar37 * pfVar12[3];
  fVar92 = fVar82 * pfVar6[3] + fVar37 * pfVar14[3];
  local_b8[0] = uVar33;
  local_b8[1] = uVar33;
  local_b8[2] = uVar33;
  local_b8[3] = uVar33;
  local_198 = (ray->dir).field_0.m128[0];
  auVar48 = *(undefined1 (*) [16])((ray->dir).field_0.m128 + 1);
  local_1a8 = auVar48._0_4_;
  local_1b8 = (ray->dir).field_0.m128[2];
  auVar86._4_12_ = auVar48._4_12_;
  auVar86._0_4_ = local_1a8 * local_1a8 + local_1b8 * local_1b8;
  auVar48._0_4_ = local_198 * local_198 + auVar86._0_4_;
  auVar48._4_4_ = auVar48._0_4_;
  auVar48._8_4_ = auVar48._0_4_;
  auVar48._12_4_ = auVar48._0_4_;
  auVar95 = rcpps(auVar86,auVar48);
  fVar121 = auVar95._0_4_;
  fVar124 = auVar95._4_4_;
  fVar126 = auVar95._8_4_;
  fVar127 = auVar95._12_4_;
  fVar37 = (ray->org).field_0.m128[1];
  fVar82 = (ray->org).field_0.m128[2];
  fVar120 = (ray->org).field_0.m128[0];
  local_1d8 = (((fVar61 + fVar101) * 0.5 - fVar120) * local_198 +
              ((fVar131 + fVar74) * 0.5 - fVar37) * local_1a8 +
              ((fVar62 + fVar44) * 0.5 - fVar82) * local_1b8) *
              ((1.0 - auVar48._0_4_ * fVar121) * fVar121 + fVar121);
  fStack_1d4 = (((fVar65 + fVar104) * 0.5 - fVar120) * local_198 +
               ((fVar134 + fVar76) * 0.5 - fVar37) * local_1a8 +
               ((fVar66 + fVar52) * 0.5 - fVar82) * local_1b8) *
               ((1.0 - auVar48._0_4_ * fVar124) * fVar124 + fVar124);
  fStack_1d0 = (((fVar68 + fVar106) * 0.5 - fVar120) * local_198 +
               ((fVar137 + fVar78) * 0.5 - fVar37) * local_1a8 +
               ((fVar69 + fVar55) * 0.5 - fVar82) * local_1b8) *
               ((1.0 - auVar48._0_4_ * fVar126) * fVar126 + fVar126);
  fStack_1cc = (((fVar71 + fVar108) * 0.5 - fVar120) * local_198 +
               ((fVar140 + fVar80) * 0.5 - fVar37) * local_1a8 +
               ((fVar72 + fVar58) * 0.5 - fVar82) * local_1b8) *
               ((1.0 - auVar48._0_4_ * fVar127) * fVar127 + fVar127);
  fVar116 = local_198 * local_1d8 + fVar120;
  fVar118 = local_198 * fStack_1d4 + fVar120;
  fVar119 = local_198 * fStack_1d0 + fVar120;
  fVar120 = local_198 * fStack_1cc + fVar120;
  fVar153 = local_1a8 * local_1d8 + fVar37;
  fVar155 = local_1a8 * fStack_1d4 + fVar37;
  fVar156 = local_1a8 * fStack_1d0 + fVar37;
  fVar37 = local_1a8 * fStack_1cc + fVar37;
  fVar128 = local_1b8 * local_1d8 + fVar82;
  fVar129 = local_1b8 * fStack_1d4 + fVar82;
  fVar130 = local_1b8 * fStack_1d0 + fVar82;
  fVar82 = local_1b8 * fStack_1cc + fVar82;
  fVar121 = fVar101 - fVar61;
  fVar124 = fVar104 - fVar65;
  fVar126 = fVar106 - fVar68;
  fVar127 = fVar108 - fVar71;
  fVar61 = fVar116 - fVar61;
  fVar65 = fVar118 - fVar65;
  fVar68 = fVar119 - fVar68;
  fVar71 = fVar120 - fVar71;
  fVar45 = fVar74 - fVar131;
  fVar53 = fVar76 - fVar134;
  fVar56 = fVar78 - fVar137;
  fVar59 = fVar80 - fVar140;
  fVar131 = fVar153 - fVar131;
  fVar134 = fVar155 - fVar134;
  fVar137 = fVar156 - fVar137;
  fVar140 = fVar37 - fVar140;
  fVar132 = fVar44 - fVar62;
  fVar135 = fVar52 - fVar66;
  fVar138 = fVar55 - fVar69;
  fVar141 = fVar58 - fVar72;
  fVar62 = fVar128 - fVar62;
  fVar66 = fVar129 - fVar66;
  fVar69 = fVar130 - fVar69;
  fVar72 = fVar82 - fVar72;
  fVar38 = fVar121 * fVar121 + fVar45 * fVar45 + fVar132 * fVar132;
  fVar41 = fVar124 * fVar124 + fVar53 * fVar53 + fVar135 * fVar135;
  fVar42 = fVar126 * fVar126 + fVar56 * fVar56 + fVar138 * fVar138;
  fVar43 = fVar127 * fVar127 + fVar59 * fVar59 + fVar141 * fVar141;
  fVar143 = fVar121 * fVar61 + fVar45 * fVar131 + fVar132 * fVar62;
  fVar146 = fVar124 * fVar65 + fVar53 * fVar134 + fVar135 * fVar66;
  fVar147 = fVar126 * fVar68 + fVar56 * fVar137 + fVar138 * fVar69;
  fVar148 = fVar127 * fVar71 + fVar59 * fVar140 + fVar141 * fVar72;
  fVar133 = fVar121 * local_198 + fVar45 * local_1a8 + fVar132 * local_1b8;
  fVar136 = fVar124 * local_198 + fVar53 * local_1a8 + fVar135 * local_1b8;
  fVar139 = fVar126 * local_198 + fVar56 * local_1a8 + fVar138 * local_1b8;
  fVar142 = fVar127 * local_198 + fVar59 * local_1a8 + fVar141 * local_1b8;
  fVar63 = fVar110 - fVar83;
  fVar67 = fVar113 - fVar88;
  fVar70 = fVar114 - fVar90;
  fVar73 = fVar115 - fVar92;
  fVar46 = fVar63 * fVar63 + fVar38;
  fVar54 = fVar67 * fVar67 + fVar41;
  fVar57 = fVar70 * fVar70 + fVar42;
  fVar60 = fVar73 * fVar73 + fVar43;
  local_c8 = fVar38 * fVar38;
  fStack_c4 = fVar41 * fVar41;
  fStack_c0 = fVar42 * fVar42;
  fStack_bc = fVar43 * fVar43;
  fVar84 = fVar133 * fVar133;
  fVar89 = fVar136 * fVar136;
  fVar91 = fVar139 * fVar139;
  fVar93 = fVar142 * fVar142;
  auVar144._0_4_ = local_c8 - fVar46 * fVar84;
  auVar144._4_4_ = fStack_c4 - fVar54 * fVar89;
  auVar144._8_4_ = fStack_c0 - fVar57 * fVar91;
  auVar144._12_4_ = fStack_bc - fVar60 * fVar93;
  fVar94 = fVar110 * fVar38;
  fVar97 = fVar113 * fVar41;
  fVar98 = fVar114 * fVar42;
  fVar99 = fVar115 * fVar43;
  fVar102 = fVar63 * fVar133 * fVar94 +
            ((local_198 * fVar61 + local_1a8 * fVar131 + local_1b8 * fVar62) * local_c8 -
            fVar133 * fVar143 * fVar46);
  fVar105 = fVar67 * fVar136 * fVar97 +
            ((local_198 * fVar65 + local_1a8 * fVar134 + local_1b8 * fVar66) * fStack_c4 -
            fVar136 * fVar146 * fVar54);
  fVar107 = fVar70 * fVar139 * fVar98 +
            ((local_198 * fVar68 + local_1a8 * fVar137 + local_1b8 * fVar69) * fStack_c0 -
            fVar139 * fVar147 * fVar57);
  fVar109 = fVar73 * fVar142 * fVar99 +
            ((local_198 * fVar71 + local_1a8 * fVar140 + local_1b8 * fVar72) * fStack_bc -
            fVar142 * fVar148 * fVar60);
  fVar94 = fVar102 * fVar102 -
           (((fVar63 + fVar63) * fVar143 - fVar94) * fVar94 +
           ((fVar61 * fVar61 + fVar131 * fVar131 + fVar62 * fVar62) * local_c8 -
           fVar143 * fVar143 * fVar46)) * auVar144._0_4_;
  fVar97 = fVar105 * fVar105 -
           (((fVar67 + fVar67) * fVar146 - fVar97) * fVar97 +
           ((fVar65 * fVar65 + fVar134 * fVar134 + fVar66 * fVar66) * fStack_c4 -
           fVar146 * fVar146 * fVar54)) * auVar144._4_4_;
  fVar98 = fVar107 * fVar107 -
           (((fVar70 + fVar70) * fVar147 - fVar98) * fVar98 +
           ((fVar68 * fVar68 + fVar137 * fVar137 + fVar69 * fVar69) * fStack_c0 -
           fVar147 * fVar147 * fVar57)) * auVar144._8_4_;
  fVar99 = fVar109 * fVar109 -
           (((fVar73 + fVar73) * fVar148 - fVar99) * fVar99 +
           ((fVar71 * fVar71 + fVar140 * fVar140 + fVar72 * fVar72) * fStack_bc -
           fVar148 * fVar148 * fVar60)) * auVar144._12_4_;
  auVar95._0_4_ = ~-(uint)((line->primIDs).field_0.i[0] == 0xffffffff) & -(uint)(0.0 <= fVar94);
  auVar95._4_4_ = ~-(uint)((line->primIDs).field_0.i[1] == 0xffffffff) & -(uint)(0.0 <= fVar97);
  auVar95._8_4_ = ~-(uint)((line->primIDs).field_0.i[2] == 0xffffffff) & -(uint)(0.0 <= fVar98);
  auVar95._12_4_ = ~-(uint)((line->primIDs).field_0.i[3] == 0xffffffff) & -(uint)(0.0 <= fVar99);
  lVar24 = (ulong)line->leftExists * 0x10;
  lVar27 = (ulong)line->rightExists * 0x10;
  iVar29 = movmskps((int)lVar30,auVar95);
  if (iVar29 != 0) {
    fVar116 = fVar116 - fVar101;
    fVar118 = fVar118 - fVar104;
    fVar119 = fVar119 - fVar106;
    fVar120 = fVar120 - fVar108;
    auVar47._0_4_ = fVar121 * fVar116;
    auVar47._4_4_ = fVar124 * fVar118;
    auVar47._8_4_ = fVar126 * fVar119;
    auVar47._12_4_ = fVar127 * fVar120;
    fVar153 = fVar153 - fVar74;
    fVar155 = fVar155 - fVar76;
    fVar156 = fVar156 - fVar78;
    fVar37 = fVar37 - fVar80;
    auVar85._0_4_ = fVar45 * fVar153;
    auVar85._4_4_ = fVar53 * fVar155;
    auVar85._8_4_ = fVar56 * fVar156;
    auVar85._12_4_ = fVar59 * fVar37;
    fVar128 = fVar128 - fVar44;
    fVar129 = fVar129 - fVar52;
    fVar130 = fVar130 - fVar55;
    fVar82 = fVar82 - fVar58;
    fVar101 = fVar132 * fVar128 + auVar85._0_4_ + auVar47._0_4_;
    fVar104 = fVar135 * fVar129 + auVar85._4_4_ + auVar47._4_4_;
    fVar106 = fVar138 * fVar130 + auVar85._8_4_ + auVar47._8_4_;
    fVar108 = fVar141 * fVar82 + auVar85._12_4_ + auVar47._12_4_;
    auVar21._4_4_ = fVar97;
    auVar21._0_4_ = fVar94;
    auVar21._8_4_ = fVar98;
    auVar21._12_4_ = fVar99;
    auVar86 = sqrtps(auVar85,auVar21);
    auVar48 = rcpps(auVar47,auVar144);
    fVar44 = auVar48._0_4_;
    fVar52 = auVar48._4_4_;
    fVar55 = auVar48._8_4_;
    fVar58 = auVar48._12_4_;
    fVar44 = (1.0 - auVar144._0_4_ * fVar44) * fVar44 + fVar44;
    fVar52 = (1.0 - auVar144._4_4_ * fVar52) * fVar52 + fVar52;
    fVar55 = (1.0 - auVar144._8_4_ * fVar55) * fVar55 + fVar55;
    fVar58 = (1.0 - auVar144._12_4_ * fVar58) * fVar58 + fVar58;
    uVar33 = -(uint)(1e-18 < ABS(auVar144._0_4_));
    uVar34 = -(uint)(1e-18 < ABS(auVar144._4_4_));
    uVar35 = -(uint)(1e-18 < ABS(auVar144._8_4_));
    uVar36 = -(uint)(1e-18 < ABS(auVar144._12_4_));
    fVar74 = (float)(~uVar33 & 0xff800000 | (uint)((-fVar102 - auVar86._0_4_) * fVar44) & uVar33);
    fVar76 = (float)(~uVar34 & 0xff800000 | (uint)((-fVar105 - auVar86._4_4_) * fVar52) & uVar34);
    fVar78 = (float)(~uVar35 & 0xff800000 | (uint)((-fVar107 - auVar86._8_4_) * fVar55) & uVar35);
    fVar80 = (float)(~uVar36 & 0xff800000 | (uint)((-fVar109 - auVar86._12_4_) * fVar58) & uVar36);
    fVar44 = (float)(~uVar33 & 0x7f800000 | (uint)((auVar86._0_4_ - fVar102) * fVar44) & uVar33);
    fVar52 = (float)(~uVar34 & 0x7f800000 | (uint)((auVar86._4_4_ - fVar105) * fVar52) & uVar34);
    fVar55 = (float)(~uVar35 & 0x7f800000 | (uint)((auVar86._8_4_ - fVar107) * fVar55) & uVar35);
    fVar58 = (float)(~uVar36 & 0x7f800000 | (uint)((auVar86._12_4_ - fVar109) * fVar58) & uVar36);
    fVar94 = fVar133 * fVar74 + fVar143;
    fVar97 = fVar136 * fVar76 + fVar146;
    fVar98 = fVar139 * fVar78 + fVar147;
    fVar99 = fVar142 * fVar80 + fVar148;
    uVar33 = -(uint)(0.0 < fVar94 && fVar94 < fVar38) & auVar95._0_4_;
    uVar34 = -(uint)(0.0 < fVar97 && fVar97 < fVar41) & auVar95._4_4_;
    uVar35 = -(uint)(0.0 < fVar98 && fVar98 < fVar42) & auVar95._8_4_;
    uVar36 = -(uint)(0.0 < fVar99 && fVar99 < fVar43) & auVar95._12_4_;
    auVar111._0_4_ = (uint)fVar74 & uVar33;
    auVar111._4_4_ = (uint)fVar76 & uVar34;
    auVar111._8_4_ = (uint)fVar78 & uVar35;
    auVar111._12_4_ = (uint)fVar80 & uVar36;
    auVar87._0_8_ = CONCAT44(~uVar34,~uVar33) & 0x7f8000007f800000;
    auVar87._8_4_ = ~uVar35 & 0x7f800000;
    auVar87._12_4_ = ~uVar36 & 0x7f800000;
    _local_178 = auVar87 | auVar111;
    fVar122 = fVar133 * fVar44 + fVar143;
    fVar125 = fVar136 * fVar52 + fVar146;
    fStack_2d0 = fVar139 * fVar55 + fVar147;
    fStack_2cc = fVar142 * fVar58 + fVar148;
    auVar49._4_4_ = -(uint)(0.0 < fVar125);
    auVar49._0_4_ = -(uint)(0.0 < fVar122);
    auVar49._8_4_ = -(uint)(0.0 < fStack_2d0);
    auVar49._12_4_ = -(uint)(0.0 < fStack_2cc);
    _local_2d8 = CONCAT44(fVar125,fVar122);
    uVar33 = -(uint)(fVar122 < fVar38 && 0.0 < fVar122) & auVar95._0_4_;
    uVar34 = -(uint)(fVar125 < fVar41 && 0.0 < fVar125) & auVar95._4_4_;
    uVar35 = -(uint)(fStack_2d0 < fVar42 && 0.0 < fStack_2d0) & auVar95._8_4_;
    uVar36 = -(uint)(fStack_2cc < fVar43 && 0.0 < fStack_2cc) & auVar95._12_4_;
    auVar154._0_4_ = (uint)fVar44 & uVar33;
    auVar154._4_4_ = (uint)fVar52 & uVar34;
    auVar154._8_4_ = (uint)fVar55 & uVar35;
    auVar154._12_4_ = (uint)fVar58 & uVar36;
    auVar123._0_8_ = CONCAT44(~uVar34,~uVar33) & 0xff800000ff800000;
    auVar123._8_4_ = ~uVar35 & 0xff800000;
    auVar123._12_4_ = ~uVar36 & 0xff800000;
    _local_258 = auVar123 | auVar154;
    auVar20._4_4_ = fVar136;
    auVar20._0_4_ = fVar133;
    auVar20._8_4_ = fVar139;
    auVar20._12_4_ = fVar142;
    auVar48 = rcpps(auVar49,auVar20);
    fVar44 = auVar48._0_4_;
    fVar55 = auVar48._4_4_;
    fVar74 = auVar48._8_4_;
    fVar78 = auVar48._12_4_;
    fVar44 = (1.0 - fVar133 * fVar44) * fVar44 + fVar44;
    fVar55 = (1.0 - fVar136 * fVar55) * fVar55 + fVar55;
    fVar74 = (1.0 - fVar139 * fVar74) * fVar74 + fVar74;
    fVar78 = (1.0 - fVar142 * fVar78) * fVar78 + fVar78;
    fVar102 = fVar133 * fVar61 - local_198 * fVar143;
    fVar105 = fVar136 * fVar65 - local_198 * fVar146;
    fVar107 = fVar139 * fVar68 - local_198 * fVar147;
    fVar109 = fVar142 * fVar71 - local_198 * fVar148;
    fVar52 = fVar133 * fVar131 - local_1a8 * fVar143;
    fVar58 = fVar136 * fVar134 - local_1a8 * fVar146;
    fVar76 = fVar139 * fVar137 - local_1a8 * fVar147;
    fVar80 = fVar142 * fVar140 - local_1a8 * fVar148;
    fVar149 = fVar133 * fVar62 - local_1b8 * fVar143;
    fVar150 = fVar136 * fVar66 - local_1b8 * fVar146;
    fVar151 = fVar139 * fVar69 - local_1b8 * fVar147;
    fVar152 = fVar142 * fVar72 - local_1b8 * fVar148;
    uVar33 = -(uint)(fVar110 * fVar110 * fVar84 <=
                    fVar102 * fVar102 + fVar52 * fVar52 + fVar149 * fVar149);
    uVar34 = -(uint)(fVar113 * fVar113 * fVar89 <=
                    fVar105 * fVar105 + fVar58 * fVar58 + fVar150 * fVar150);
    uVar35 = -(uint)(fVar114 * fVar114 * fVar91 <=
                    fVar107 * fVar107 + fVar76 * fVar76 + fVar151 * fVar151);
    uVar36 = -(uint)(fVar115 * fVar115 * fVar93 <=
                    fVar109 * fVar109 + fVar80 * fVar80 + fVar152 * fVar152);
    local_148._0_4_ = (undefined4)*(undefined8 *)(mm_lookupmask_ps + lVar24);
    local_148._4_4_ = (undefined4)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar24) >> 0x20);
    fStack_140 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar24 + 8);
    fStack_13c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar24 + 8) >> 0x20);
    auVar103._0_4_ =
         (uVar33 & 0x7f800000 | ~uVar33 & (uint)(-fVar143 * fVar44)) &
         ~local_148._0_4_ & auVar95._0_4_;
    auVar103._4_4_ =
         (uVar34 & 0x7f800000 | ~uVar34 & (uint)(-fVar146 * fVar55)) &
         ~local_148._4_4_ & auVar95._4_4_;
    auVar103._8_4_ =
         (uVar35 & 0x7f800000 | ~uVar35 & (uint)(-fVar147 * fVar74)) &
         ~(uint)fStack_140 & auVar95._8_4_;
    auVar103._12_4_ =
         (uVar36 & 0x7f800000 | ~uVar36 & (uint)(-fVar148 * fVar78)) &
         ~(uint)fStack_13c & auVar95._12_4_;
    auVar64._0_8_ =
         CONCAT44(~(~local_148._4_4_ & auVar95._4_4_),~(~local_148._0_4_ & auVar95._0_4_)) &
         0x7f8000007f800000;
    auVar64._8_4_ = ~(~(uint)fStack_140 & auVar95._8_4_) & 0x7f800000;
    auVar64._12_4_ = ~(~(uint)fStack_13c & auVar95._12_4_) & 0x7f800000;
    _local_148 = auVar64 | auVar103;
    fVar76 = fVar116 * fVar133 - local_198 * fVar101;
    fVar80 = fVar118 * fVar136 - local_198 * fVar104;
    fVar102 = fVar119 * fVar139 - local_198 * fVar106;
    fVar105 = fVar120 * fVar142 - local_198 * fVar108;
    fVar120 = fVar153 * fVar133 - local_1a8 * fVar101;
    fVar52 = fVar155 * fVar136 - local_1a8 * fVar104;
    fVar58 = fVar156 * fVar139 - local_1a8 * fVar106;
    fVar153 = fVar37 * fVar142 - local_1a8 * fVar108;
    fVar155 = fVar128 * fVar133 - local_1b8 * fVar101;
    fVar156 = fVar129 * fVar136 - local_1b8 * fVar104;
    fVar107 = fVar130 * fVar139 - local_1b8 * fVar106;
    fVar82 = fVar82 * fVar142 - local_1b8 * fVar108;
    fVar37 = (ray->org).field_0.m128[3];
    uVar33 = -(uint)(fVar83 * fVar83 * fVar84 <=
                    fVar76 * fVar76 + fVar120 * fVar120 + fVar155 * fVar155);
    uVar34 = -(uint)(fVar88 * fVar88 * fVar89 <=
                    fVar80 * fVar80 + fVar52 * fVar52 + fVar156 * fVar156);
    uVar35 = -(uint)(fVar90 * fVar90 * fVar91 <=
                    fVar102 * fVar102 + fVar58 * fVar58 + fVar107 * fVar107);
    uVar36 = -(uint)(fVar92 * fVar92 * fVar93 <=
                    fVar105 * fVar105 + fVar153 * fVar153 + fVar82 * fVar82);
    auVar117._0_4_ =
         (uVar33 & 0x7f800000 | ~uVar33 & (uint)(-fVar101 * fVar44)) &
         ~*(uint *)(mm_lookupmask_ps + lVar27) & auVar95._0_4_;
    auVar117._4_4_ =
         (uVar34 & 0x7f800000 | ~uVar34 & (uint)(-fVar104 * fVar55)) &
         ~*(uint *)(mm_lookupmask_ps + lVar27 + 4) & auVar95._4_4_;
    auVar117._8_4_ =
         (uVar35 & 0x7f800000 | ~uVar35 & (uint)(-fVar106 * fVar74)) &
         ~*(uint *)(mm_lookupmask_ps + lVar27 + 8) & auVar95._8_4_;
    auVar117._12_4_ =
         (uVar36 & 0x7f800000 | ~uVar36 & (uint)(-fVar108 * fVar78)) &
         ~*(uint *)(mm_lookupmask_ps + lVar27 + 0xc) & auVar95._12_4_;
    auVar39._0_8_ =
         CONCAT44(~(~*(uint *)(mm_lookupmask_ps + lVar27 + 4) & auVar95._4_4_),
                  ~(~*(uint *)(mm_lookupmask_ps + lVar27) & auVar95._0_4_)) & 0x7f8000007f800000;
    auVar39._8_4_ = ~(~*(uint *)(mm_lookupmask_ps + lVar27 + 8) & auVar95._8_4_) & 0x7f800000;
    auVar39._12_4_ = ~(~*(uint *)(mm_lookupmask_ps + lVar27 + 0xc) & auVar95._12_4_) & 0x7f800000;
    auVar48 = minps(_local_148,auVar39 | auVar117);
    auVar86 = maxps(_local_148,auVar39 | auVar117);
    auVar144 = minps(_local_178,auVar48);
    fVar155 = auVar144._0_4_;
    fVar78 = auVar144._4_4_;
    fVar156 = auVar144._8_4_;
    fVar80 = auVar144._12_4_;
    fVar82 = auVar48._0_4_;
    fVar120 = auVar48._4_4_;
    fVar44 = auVar48._8_4_;
    fVar52 = auVar48._12_4_;
    uVar33 = -(uint)(auVar86._0_4_ != INFINITY);
    uVar34 = -(uint)(auVar86._4_4_ != INFINITY);
    uVar35 = -(uint)(auVar86._8_4_ != INFINITY);
    uVar36 = -(uint)(auVar86._12_4_ != INFINITY);
    auVar96._0_4_ =
         (~-(uint)(fVar82 != INFINITY) & 0xff800000 | (uint)fVar82 & -(uint)(fVar82 != INFINITY)) &
         -(uint)(fVar155 != fVar82);
    auVar96._4_4_ =
         (~-(uint)(fVar120 != INFINITY) & 0xff800000 | (uint)fVar120 & -(uint)(fVar120 != INFINITY))
         & -(uint)(fVar78 != fVar120);
    auVar96._8_4_ =
         (~-(uint)(fVar44 != INFINITY) & 0xff800000 | (uint)fVar44 & -(uint)(fVar44 != INFINITY)) &
         -(uint)(fVar156 != fVar44);
    auVar96._12_4_ =
         (~-(uint)(fVar52 != INFINITY) & 0xff800000 | (uint)fVar52 & -(uint)(fVar52 != INFINITY)) &
         -(uint)(fVar80 != fVar52);
    auVar112._0_4_ =
         ~-(uint)(fVar155 != fVar82) & (~uVar33 & 0xff800000 | (uint)auVar86._0_4_ & uVar33);
    auVar112._4_4_ =
         ~-(uint)(fVar78 != fVar120) & (~uVar34 & 0xff800000 | (uint)auVar86._4_4_ & uVar34);
    auVar112._8_4_ =
         ~-(uint)(fVar156 != fVar44) & (~uVar35 & 0xff800000 | (uint)auVar86._8_4_ & uVar35);
    auVar112._12_4_ =
         ~-(uint)(fVar80 != fVar52) & (~uVar36 & 0xff800000 | (uint)auVar86._12_4_ & uVar36);
    _local_48 = maxps(_local_258,auVar112 | auVar96);
    fVar82 = ray->tfar;
    local_168 = -(uint)((fVar37 <= local_1d8 + fVar155 && local_1d8 + fVar155 <= fVar82) &&
                       fVar155 != INFINITY);
    uStack_164 = -(uint)((fVar37 <= fStack_1d4 + fVar78 && fStack_1d4 + fVar78 <= fVar82) &&
                        fVar78 != INFINITY);
    uStack_160 = -(uint)((fVar37 <= fStack_1d0 + fVar156 && fStack_1d0 + fVar156 <= fVar82) &&
                        fVar156 != INFINITY);
    uStack_15c = -(uint)((fVar37 <= fStack_1cc + fVar80 && fStack_1cc + fVar80 <= fVar82) &&
                        fVar80 != INFINITY);
    fVar58 = local_48._0_4_;
    fVar120 = local_1d8 + fVar58;
    fVar74 = local_48._4_4_;
    fVar44 = fStack_1d4 + fVar74;
    fVar153 = local_48._8_4_;
    fVar52 = fStack_1d0 + fVar153;
    fVar76 = local_48._12_4_;
    fVar55 = fStack_1cc + fVar76;
    uVar34 = local_168 & auVar95._0_4_;
    uVar35 = uStack_164 & auVar95._4_4_;
    auVar50._4_4_ = uVar35;
    auVar50._0_4_ = uVar34;
    uVar36 = uStack_160 & auVar95._8_4_;
    uVar100 = uStack_15c & auVar95._12_4_;
    local_248._0_4_ =
         -(uint)(fVar58 != -INFINITY) & auVar95._0_4_ &
         -(uint)(fVar120 <= fVar82 && fVar37 <= fVar120);
    local_248._4_4_ =
         -(uint)(fVar74 != -INFINITY) & auVar95._4_4_ &
         -(uint)(fVar44 <= fVar82 && fVar37 <= fVar44);
    local_248._8_4_ =
         -(uint)(fVar153 != -INFINITY) & auVar95._8_4_ &
         -(uint)(fVar52 <= fVar82 && fVar37 <= fVar52);
    local_248._12_4_ =
         -(uint)(fVar76 != -INFINITY) & auVar95._12_4_ &
         -(uint)(fVar55 <= fVar82 && fVar37 <= fVar55);
    auVar50._8_4_ = uVar36;
    auVar50._12_4_ = uVar100;
    uVar33 = movmskps((int)lVar24,auVar50 | local_248);
    if (uVar33 != 0) {
      auVar51._0_4_ = ~uVar34 & (uint)fVar58;
      auVar51._4_4_ = ~uVar35 & (uint)fVar74;
      auVar51._8_4_ = ~uVar36 & (uint)fVar153;
      auVar51._12_4_ = ~uVar100 & (uint)fVar76;
      auVar145._0_4_ = (uint)fVar155 & uVar34;
      auVar145._4_4_ = (uint)fVar78 & uVar35;
      auVar145._8_4_ = (uint)fVar156 & uVar36;
      auVar145._12_4_ = (uint)fVar80 & uVar100;
      auVar145 = auVar145 | auVar51;
      fVar153 = (float)(~uVar34 & (uint)fVar122 | (uint)fVar94 & uVar34);
      fVar76 = (float)(~uVar35 & (uint)fVar125 | (uint)fVar97 & uVar35);
      fVar155 = (float)(~uVar36 & (uint)fStack_2d0 | (uint)fVar98 & uVar36);
      fVar78 = (float)(~uVar100 & (uint)fStack_2cc | (uint)fVar99 & uVar100);
      auVar22._4_4_ = fVar41;
      auVar22._0_4_ = fVar38;
      auVar22._8_4_ = fVar42;
      auVar22._12_4_ = fVar43;
      auVar48 = rcpps(auVar51,auVar22);
      fVar37 = auVar48._0_4_;
      fVar82 = auVar48._4_4_;
      fVar58 = auVar48._8_4_;
      fVar74 = auVar48._12_4_;
      fVar37 = (1.0 - fVar38 * fVar37) * fVar37 + fVar37;
      fVar82 = (1.0 - fVar41 * fVar82) * fVar82 + fVar82;
      fVar58 = (1.0 - fVar42 * fVar58) * fVar58 + fVar58;
      fVar74 = (1.0 - fVar43 * fVar74) * fVar74 + fVar74;
      fVar110 = fVar110 * fVar63 * fVar38;
      fVar113 = fVar113 * fVar67 * fVar41;
      fVar114 = fVar114 * fVar70 * fVar42;
      fVar115 = fVar115 * fVar73 * fVar43;
      local_188 = fVar45 * fVar110;
      fStack_184 = fVar53 * fVar113;
      fStack_180 = fVar56 * fVar114;
      fStack_17c = fVar59 * fVar115;
      fStack_2e0 = fVar114 * fVar138;
      fStack_2dc = fVar115 * fVar141;
      local_158 = fVar46 * fVar132;
      fStack_154 = fVar54 * fVar135;
      fStack_150 = fVar57 * fVar138;
      fStack_14c = fVar60 * fVar141;
      fVar38 = auVar145._0_4_;
      fVar41 = auVar145._4_4_;
      fVar42 = auVar145._8_4_;
      fVar43 = auVar145._12_4_;
      uVar75 = -(uint)(fVar38 == local_258._0_4_ || fVar38 == local_178._0_4_) & auVar95._0_4_;
      uVar77 = -(uint)(fVar41 == local_258._4_4_ || fVar41 == local_178._4_4_) & auVar95._4_4_;
      uVar79 = -(uint)(fVar42 == local_258._8_4_ || fVar42 == local_178._8_4_) & auVar95._8_4_;
      uVar81 = -(uint)(fVar43 == local_258._12_4_ || fVar43 == local_178._12_4_) & auVar95._12_4_;
      uVar34 = -(uint)(fVar38 == local_148._0_4_) & auVar95._0_4_;
      uVar35 = -(uint)(fVar41 == local_148._4_4_) & auVar95._4_4_;
      uVar36 = -(uint)(fVar42 == local_148._8_4_) & auVar95._8_4_;
      uVar100 = -(uint)(fVar43 == local_148._12_4_) & auVar95._12_4_;
      local_68 = fVar121 * fVar110;
      fStack_64 = fVar124 * fVar113;
      fStack_60 = fVar126 * fVar114;
      fStack_5c = fVar127 * fVar115;
      _local_2e8 = CONCAT44(fVar113 * fVar135,fVar110 * fVar132);
      local_88 = fVar121 * fVar46;
      fStack_84 = fVar124 * fVar54;
      fStack_80 = fVar126 * fVar57;
      fStack_7c = fVar127 * fVar60;
      local_78 = fVar45 * fVar46;
      fStack_74 = fVar53 * fVar54;
      fStack_70 = fVar56 * fVar57;
      fStack_6c = fVar59 * fVar60;
      local_a8 = -fVar121;
      fStack_a4 = -fVar124;
      fStack_a0 = -fVar126;
      fStack_9c = -fVar127;
      local_98 = -fVar45;
      fStack_94 = -fVar53;
      fStack_90 = -fVar56;
      fStack_8c = -fVar59;
      local_318._0_8_ = CONCAT44(fVar135,fVar132) ^ 0x8000000080000000;
      local_318._8_4_ = -fVar138;
      fStack_30c = -fVar141;
      local_58 = ~uVar34 & 0x3f800000;
      uStack_54 = ~uVar35 & 0x3f800000;
      uStack_50 = ~uVar36 & 0x3f800000;
      uStack_4c = ~uVar100 & 0x3f800000;
      local_138[0] = ~uVar75 & ~uVar34 & 0x3f800000 | (uint)(fVar153 * fVar37) & uVar75;
      local_138[1] = ~uVar77 & ~uVar35 & 0x3f800000 | (uint)(fVar76 * fVar82) & uVar77;
      local_138[2] = ~uVar79 & ~uVar36 & 0x3f800000 | (uint)(fVar155 * fVar58) & uVar79;
      local_138[3] = ~uVar81 & ~uVar100 & 0x3f800000 | (uint)(fVar78 * fVar74) & uVar81;
      local_128 = ZEXT816(0);
      local_118[0] = local_1d8 + fVar38;
      local_118[1] = fStack_1d4 + fVar41;
      local_118[2] = fStack_1d0 + fVar42;
      local_118[3] = fStack_1cc + fVar43;
      local_108[0] = (uint)(((local_198 * fVar38 + fVar61) * local_c8 + fVar121 * fVar110) -
                           fVar121 * fVar46 * fVar153) & uVar75 |
                     ~uVar75 & ((uint)-fVar121 & uVar34 | ~uVar34 & (uint)fVar121);
      local_108[1] = (uint)(((local_198 * fVar41 + fVar65) * fStack_c4 + fVar124 * fVar113) -
                           fVar124 * fVar54 * fVar76) & uVar77 |
                     ~uVar77 & ((uint)-fVar124 & uVar35 | ~uVar35 & (uint)fVar124);
      local_108[2] = (uint)(((local_198 * fVar42 + fVar68) * fStack_c0 + fVar126 * fVar114) -
                           fVar126 * fVar57 * fVar155) & uVar79 |
                     ~uVar79 & ((uint)-fVar126 & uVar36 | ~uVar36 & (uint)fVar126);
      local_108[3] = (uint)(((local_198 * fVar43 + fVar71) * fStack_bc + fVar127 * fVar115) -
                           fVar127 * fVar60 * fVar78) & uVar81 |
                     ~uVar81 & ((uint)-fVar127 & uVar100 | ~uVar100 & (uint)fVar127);
      local_f8[0] = (uint)(((local_1a8 * fVar38 + fVar131) * local_c8 + local_188) -
                          fVar45 * fVar46 * fVar153) & uVar75 |
                    ~uVar75 & ((uint)-fVar45 & uVar34 | ~uVar34 & (uint)fVar45);
      local_f8[1] = (uint)(((local_1a8 * fVar41 + fVar134) * fStack_c4 + fStack_184) -
                          fVar53 * fVar54 * fVar76) & uVar77 |
                    ~uVar77 & ((uint)-fVar53 & uVar35 | ~uVar35 & (uint)fVar53);
      local_f8[2] = (uint)(((local_1a8 * fVar42 + fVar137) * fStack_c0 + fStack_180) -
                          fVar56 * fVar57 * fVar155) & uVar79 |
                    ~uVar79 & ((uint)-fVar56 & uVar36 | ~uVar36 & (uint)fVar56);
      local_f8[3] = (uint)(((local_1a8 * fVar43 + fVar140) * fStack_bc + fStack_17c) -
                          fVar59 * fVar60 * fVar78) & uVar81 |
                    ~uVar81 & ((uint)-fVar59 & uVar100 | ~uVar100 & (uint)fVar59);
      local_e8[0] = (uint)(((local_1b8 * fVar38 + fVar62) * local_c8 + fVar110 * fVar132) -
                          local_158 * fVar153) & uVar75 |
                    ~uVar75 & ((uint)-fVar132 & uVar34 | ~uVar34 & (uint)fVar132);
      local_e8[1] = (uint)(((local_1b8 * fVar41 + fVar66) * fStack_c4 + fVar113 * fVar135) -
                          fStack_154 * fVar76) & uVar77 |
                    ~uVar77 & ((uint)-fVar135 & uVar35 | ~uVar35 & (uint)fVar135);
      local_e8[2] = (uint)(((local_1b8 * fVar42 + fVar69) * fStack_c0 + fStack_2e0) -
                          fStack_150 * fVar155) & uVar79 |
                    ~uVar79 & ((uint)-fVar138 & uVar36 | ~uVar36 & (uint)fVar138);
      local_e8[3] = (uint)(((local_1b8 * fVar43 + fVar72) * fStack_bc + fStack_2dc) -
                          fStack_14c * fVar78) & uVar81 |
                    ~uVar81 & ((uint)-fVar141 & uVar100 | ~uVar100 & (uint)fVar141);
      uVar32 = (ulong)(uVar33 & 0xff);
      pRVar31 = local_300;
      fStack_2f0 = fVar69;
      fStack_2ec = fVar72;
      local_2c8 = fVar37;
      fStack_2c4 = fVar82;
      fStack_2c0 = fVar58;
      fStack_2bc = fVar74;
      local_238 = fVar120;
      fStack_234 = fVar44;
      fStack_230 = fVar52;
      fStack_22c = fVar55;
      local_228 = fVar131;
      fStack_224 = fVar134;
      fStack_220 = fVar137;
      fStack_21c = fVar140;
      local_218 = fVar61;
      fStack_214 = fVar65;
      fStack_210 = fVar68;
      fStack_20c = fVar71;
      local_208 = fVar132;
      fStack_204 = fVar135;
      fStack_200 = fVar138;
      fStack_1fc = fVar141;
      local_1f8 = fVar45;
      fStack_1f4 = fVar53;
      fStack_1f0 = fVar56;
      fStack_1ec = fVar59;
      local_1e0 = line;
      local_1c8 = fVar121;
      fStack_1c4 = fVar124;
      fStack_1c0 = fVar126;
      fStack_1bc = fVar127;
      fStack_1b4 = local_1b8;
      fStack_1b0 = local_1b8;
      fStack_1ac = local_1b8;
      fStack_1a4 = local_1a8;
      fStack_1a0 = local_1a8;
      fStack_19c = local_1a8;
      fStack_194 = local_198;
      fStack_190 = local_198;
      fStack_18c = local_198;
      local_2f8 = fVar62;
      fStack_2f4 = fVar66;
      do {
        local_2b8.valid = &local_31c;
        uVar19 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_270 = local_b8[uVar19];
        pGVar15 = (pSVar18->geometries).items[(long)(ulong)local_270].ptr;
        local_2b8.ray = (RTCRayN *)ray;
        if ((pGVar15->mask & ray->mask) == 0) {
LAB_00ba8e72:
          uVar32 = uVar32 ^ 1L << (uVar19 & 0x3f);
          bVar28 = 1;
        }
        else {
          if ((pRVar31->args->filter != (RTCFilterFunctionN)0x0) ||
             (p_Var25 = (RTCFilterFunctionN)(ulong)local_270,
             pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_27c = local_138[uVar19];
            local_278 = local_118[uVar19 - 4];
            local_274 = (local_1e0->primIDs).field_0.i[uVar19];
            local_288 = local_108[uVar19];
            local_284 = local_f8[uVar19];
            local_280 = local_e8[uVar19];
            local_26c = pRVar31->user->instID[0];
            local_268 = pRVar31->user->instPrimID[0];
            local_1d8 = ray->tfar;
            ray->tfar = local_118[uVar19];
            local_31c = -1;
            local_2b8.geometryUserPtr = pGVar15->userPtr;
            local_2b8.context = pRVar31->user;
            local_2b8.N = 1;
            local_2b8.hit = (RTCHitN *)&local_288;
            if ((pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar15->occlusionFilterN)(&local_2b8), pRVar31 = local_300, fVar121 = local_1c8,
               fVar124 = fStack_1c4, fVar126 = fStack_1c0, fVar127 = fStack_1bc, fVar45 = local_1f8,
               fVar53 = fStack_1f4, fVar56 = fStack_1f0, fVar59 = fStack_1ec, fVar132 = local_208,
               fVar135 = fStack_204, fVar138 = fStack_200, fVar141 = fStack_1fc, fVar37 = local_2c8,
               fVar82 = fStack_2c4, fVar58 = fStack_2c0, fVar74 = fStack_2bc, fVar61 = local_218,
               fVar65 = fStack_214, fVar68 = fStack_210, fVar71 = fStack_20c, fVar131 = local_228,
               fVar134 = fStack_224, fVar137 = fStack_220, fVar140 = fStack_21c, fVar120 = local_238
               , fVar44 = fStack_234, fVar52 = fStack_230, fVar55 = fStack_22c, fVar62 = local_2f8,
               fVar66 = fStack_2f4, fVar69 = fStack_2f0, fVar72 = fStack_2ec, *local_2b8.valid == 0)
               ) {
LAB_00ba9065:
              local_270 = (uint)local_2b8.valid;
              ray->tfar = local_1d8;
              goto LAB_00ba8e72;
            }
            p_Var25 = pRVar31->args->filter;
            if (p_Var25 != (RTCFilterFunctionN)0x0) {
              if (((pRVar31->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var25)(&local_2b8);
                pRVar31 = local_300;
                fVar121 = local_1c8;
                fVar124 = fStack_1c4;
                fVar126 = fStack_1c0;
                fVar127 = fStack_1bc;
                fVar45 = local_1f8;
                fVar53 = fStack_1f4;
                fVar56 = fStack_1f0;
                fVar59 = fStack_1ec;
                fVar132 = local_208;
                fVar135 = fStack_204;
                fVar138 = fStack_200;
                fVar141 = fStack_1fc;
                fVar37 = local_2c8;
                fVar82 = fStack_2c4;
                fVar58 = fStack_2c0;
                fVar74 = fStack_2bc;
                fVar61 = local_218;
                fVar65 = fStack_214;
                fVar68 = fStack_210;
                fVar71 = fStack_20c;
                fVar131 = local_228;
                fVar134 = fStack_224;
                fVar137 = fStack_220;
                fVar140 = fStack_21c;
                fVar120 = local_238;
                fVar44 = fStack_234;
                fVar52 = fStack_230;
                fVar55 = fStack_22c;
                fVar62 = local_2f8;
                fVar66 = fStack_2f4;
                fVar69 = fStack_2f0;
                fVar72 = fStack_2ec;
              }
              p_Var25 = (RTCFilterFunctionN)local_2b8.valid;
              if (*local_2b8.valid == 0) goto LAB_00ba9065;
            }
          }
          local_270 = (uint)p_Var25;
          bVar28 = 0;
        }
      } while ((bVar28 != 0) && (uVar32 != 0));
      fVar38 = ray->tfar;
      auVar40._0_4_ = local_168 & local_248._0_4_ & -(uint)(fVar120 <= fVar38);
      auVar40._4_4_ = uStack_164 & local_248._4_4_ & -(uint)(fVar44 <= fVar38);
      auVar40._8_4_ = uStack_160 & local_248._8_4_ & -(uint)(fVar52 <= fVar38);
      auVar40._12_4_ = uStack_15c & local_248._12_4_ & -(uint)(fVar55 <= fVar38);
      uVar33 = movmskps(local_270,auVar40);
      if (uVar33 == 0) {
        return (bool)(bVar28 ^ 1);
      }
      uVar75 = -(uint)((float)local_178._0_4_ != (float)local_48._0_4_ &&
                      (float)local_258._0_4_ != (float)local_48._0_4_);
      uVar77 = -(uint)((float)local_178._4_4_ != (float)local_48._4_4_ &&
                      (float)local_258._4_4_ != (float)local_48._4_4_);
      uVar79 = -(uint)(fStack_170 != fStack_40 && fStack_250 != fStack_40);
      uVar81 = -(uint)(fStack_16c != fStack_3c && fStack_24c != fStack_3c);
      uVar34 = -(uint)((float)local_148._0_4_ != (float)local_48._0_4_);
      uVar35 = -(uint)((float)local_148._4_4_ != (float)local_48._4_4_);
      uVar36 = -(uint)(fStack_140 != fStack_40);
      uVar100 = -(uint)(fStack_13c != fStack_3c);
      local_138[0] = ~uVar75 & (uint)(fVar37 * local_2d8) | local_58 & uVar75;
      local_138[1] = ~uVar77 & (uint)(fVar82 * fStack_2d4) | uStack_54 & uVar77;
      local_138[2] = ~uVar79 & (uint)(fVar58 * fStack_2d0) | uStack_50 & uVar79;
      local_138[3] = ~uVar81 & (uint)(fVar74 * fStack_2cc) | uStack_4c & uVar81;
      local_128 = ZEXT816(0);
      local_118[0] = fVar120;
      local_118[1] = fVar44;
      local_118[2] = fVar52;
      local_118[3] = fVar55;
      local_108[0] = ~uVar75 & (uint)((local_68 +
                                      (fVar61 + local_198 * (float)local_48._0_4_) * local_c8) -
                                     local_88 * local_2d8) |
                     ((uint)fVar121 & uVar34 | ~uVar34 & (uint)local_a8) & uVar75;
      local_108[1] = ~uVar77 & (uint)((fStack_64 +
                                      (fVar65 + fStack_194 * (float)local_48._4_4_) * fStack_c4) -
                                     fStack_84 * fStack_2d4) |
                     ((uint)fVar124 & uVar35 | ~uVar35 & (uint)fStack_a4) & uVar77;
      local_108[2] = ~uVar79 & (uint)((fStack_60 + (fVar68 + fStack_190 * fStack_40) * fStack_c0) -
                                     fStack_80 * fStack_2d0) |
                     ((uint)fVar126 & uVar36 | ~uVar36 & (uint)fStack_a0) & uVar79;
      local_108[3] = ~uVar81 & (uint)((fStack_5c + (fVar71 + fStack_18c * fStack_3c) * fStack_bc) -
                                     fStack_7c * fStack_2cc) |
                     ((uint)fVar127 & uVar100 | ~uVar100 & (uint)fStack_9c) & uVar81;
      local_f8[0] = ~uVar75 & (uint)((local_188 +
                                     (fVar131 + local_1a8 * (float)local_48._0_4_) * local_c8) -
                                    local_78 * local_2d8) |
                    ((uint)fVar45 & uVar34 | ~uVar34 & (uint)local_98) & uVar75;
      local_f8[1] = ~uVar77 & (uint)((fStack_184 +
                                     (fVar134 + fStack_1a4 * (float)local_48._4_4_) * fStack_c4) -
                                    fStack_74 * fStack_2d4) |
                    ((uint)fVar53 & uVar35 | ~uVar35 & (uint)fStack_94) & uVar77;
      local_f8[2] = ~uVar79 & (uint)((fStack_180 + (fVar137 + fStack_1a0 * fStack_40) * fStack_c0) -
                                    fStack_70 * fStack_2d0) |
                    ((uint)fVar56 & uVar36 | ~uVar36 & (uint)fStack_90) & uVar79;
      local_f8[3] = ~uVar81 & (uint)((fStack_17c + (fVar140 + fStack_19c * fStack_3c) * fStack_bc) -
                                    fStack_6c * fStack_2cc) |
                    ((uint)fVar59 & uVar100 | ~uVar100 & (uint)fStack_8c) & uVar81;
      local_e8[0] = ~uVar75 & (uint)((local_2e8 +
                                     (fVar62 + local_1b8 * (float)local_48._0_4_) * local_c8) -
                                    local_158 * local_2d8) |
                    (~uVar34 & local_318._0_4_ | (uint)fVar132 & uVar34) & uVar75;
      local_e8[1] = ~uVar77 & (uint)((fStack_2e4 +
                                     (fVar66 + fStack_1b4 * (float)local_48._4_4_) * fStack_c4) -
                                    fStack_154 * fStack_2d4) |
                    (~uVar35 & local_318._4_4_ | (uint)fVar135 & uVar35) & uVar77;
      local_e8[2] = ~uVar79 & (uint)((fStack_2e0 + (fVar69 + fStack_1b0 * fStack_40) * fStack_c0) -
                                    fStack_150 * fStack_2d0) |
                    (~uVar36 & local_318._8_4_ | (uint)fVar138 & uVar36) & uVar79;
      local_e8[3] = ~uVar81 & (uint)((fStack_2dc + (fVar72 + fStack_1ac * fStack_3c) * fStack_bc) -
                                    fStack_14c * fStack_2cc) |
                    (~uVar100 & (uint)fStack_30c | (uint)fVar141 & uVar100) & uVar81;
      pSVar18 = pRVar31->scene;
      uVar32 = (ulong)(uVar33 & 0xff);
      do {
        local_2b8.valid = &local_31c;
        local_2b8.hit = (RTCHitN *)&local_288;
        uVar19 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        local_270 = local_b8[uVar19];
        pGVar15 = (pSVar18->geometries).items[local_270].ptr;
        if ((pGVar15->mask & ray->mask) == 0) {
LAB_00ba925f:
          uVar32 = uVar32 ^ 1L << (uVar19 & 0x3f);
          bVar23 = 1;
        }
        else {
          if ((pRVar31->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_27c = local_138[uVar19];
            local_278 = local_118[uVar19 - 4];
            local_274 = (local_1e0->primIDs).field_0.i[uVar19];
            local_288 = local_108[uVar19];
            local_284 = local_f8[uVar19];
            local_280 = local_e8[uVar19];
            local_26c = pRVar31->user->instID[0];
            local_268 = pRVar31->user->instPrimID[0];
            local_318._0_4_ = ray->tfar;
            ray->tfar = local_118[uVar19];
            local_31c = -1;
            local_2b8.geometryUserPtr = pGVar15->userPtr;
            local_2b8.context = pRVar31->user;
            local_2b8.N = 1;
            local_2b8.ray = (RTCRayN *)ray;
            if ((pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar15->occlusionFilterN)(&local_2b8), pRVar31 = local_300, *local_2b8.valid == 0
               )) {
LAB_00ba93d0:
              ray->tfar = (float)local_318._0_4_;
              goto LAB_00ba925f;
            }
            p_Var25 = pRVar31->args->filter;
            if (p_Var25 != (RTCFilterFunctionN)0x0) {
              if (((pRVar31->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var25)(&local_2b8);
                pRVar31 = local_300;
              }
              if (*local_2b8.valid == 0) goto LAB_00ba93d0;
            }
          }
          bVar23 = 0;
        }
        if ((bVar23 == 0) || (uVar32 == 0)) {
          return (bool)(bVar28 ^ 1 | bVar23 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time());
        const vbool<M> valid = line.valid();
        return ConeCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,cL,cR,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
        return false;
      }